

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O0

bool helics::checkForNeededCoreRetrieval
               (size_t currentIndex,DataType injectionType,DataType conversionType)

{
  const_reference pvVar1;
  value_type in_EDX;
  value_type in_ESI;
  long in_RDI;
  size_type in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  bool local_1;
  
  pvVar1 = std::array<helics::DataType,_7UL>::operator[]
                     ((array<helics::DataType,_7UL> *)
                      CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
  if ((*pvVar1 == in_ESI) ||
     (pvVar1 = std::array<helics::DataType,_7UL>::operator[]
                         ((array<helics::DataType,_7UL> *)
                          CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                          in_stack_ffffffffffffffd8), *pvVar1 == in_EDX)) {
    local_1 = false;
  }
  else {
    local_1 = in_RDI == 1 || in_EDX != HELICS_DOUBLE;
  }
  return local_1;
}

Assistant:

bool checkForNeededCoreRetrieval(std::size_t currentIndex,
                                 DataType injectionType,
                                 DataType conversionType)
{
    static constexpr std::array<DataType, 7> locType{{DataType::HELICS_DOUBLE,
                                                      DataType::HELICS_INT,
                                                      DataType::HELICS_STRING,
                                                      DataType::HELICS_COMPLEX,
                                                      DataType::HELICS_VECTOR,
                                                      DataType::HELICS_COMPLEX_VECTOR,
                                                      DataType::HELICS_NAMED_POINT}};

    if (locType[currentIndex] == injectionType || locType[currentIndex] == conversionType) {
        return false;
    }

    return !(currentIndex != int_loc && conversionType == DataType::HELICS_DOUBLE);
}